

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSphericalHarmonic.cpp
# Opt level: O2

RealType __thiscall
OpenMD::RealSphericalHarmonic::getValueAt
          (RealSphericalHarmonic *this,RealType costheta,RealType phi)

{
  RealType RVar1;
  double dVar2;
  
  RVar1 = LegendreP(this,this->L,this->M,costheta);
  dVar2 = (double)this->M * phi;
  if (this->functionType == 0) {
    dVar2 = sin(dVar2);
  }
  else {
    dVar2 = cos(dVar2);
  }
  return RVar1 * this->coefficient * dVar2;
}

Assistant:

RealType RealSphericalHarmonic::getValueAt(RealType costheta, RealType phi) {
  RealType p, phase;

  // associated Legendre polynomial
  p = LegendreP(L, M, costheta);

  if (functionType == RSH_SIN) {
    phase = sin((RealType)M * phi);
  } else {
    phase = cos((RealType)M * phi);
  }

  return coefficient * p * phase;
}